

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void computeYMD(DateTime *p)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    p->Y = 2000;
    p->M = 1;
    iVar5 = 1;
    lVar4 = 0x10;
  }
  else {
    if (0x1a6401072fdff < (ulong)p->iJD) {
      p->s = 0.0;
      p->validJD = '\0';
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->nFloor = '\0';
      *(undefined4 *)&p->field_0x2c = 0;
      p->D = 0;
      p->h = 0;
      p->m = 0;
      p->tz = 0;
      p->iJD = 0;
      p->Y = 0;
      p->M = 0;
      p->field_0x2c = p->field_0x2c | 2;
      return;
    }
    iVar6 = (int)((p->iJD + 43200000U) / 86400000);
    iVar2 = (int)(((double)iVar6 + 32044.75) / 36524.25);
    iVar5 = iVar2 + 0x33;
    if (-1 < iVar2 + 0x30) {
      iVar5 = iVar2 + 0x30;
    }
    iVar2 = ((iVar6 + iVar2) - (iVar5 >> 2)) + 0x5da;
    uVar3 = (uint)(((double)iVar2 + -122.1) / 365.25);
    iVar2 = iVar2 - ((uVar3 & 0x7fff) * 0x8ead) / 100;
    dVar1 = (double)iVar2 / 30.6001;
    iVar5 = (int)dVar1;
    p->D = iVar2 - (int)((double)(int)dVar1 * 30.6001);
    iVar5 = (-(uint)(iVar5 < 0xe) | 0xfffffff3) + iVar5;
    p->M = iVar5;
    iVar5 = (2 < iVar5 ^ 0xffffed95) + uVar3;
    lVar4 = 8;
  }
  *(int *)((long)&p->iJD + lVar4) = iVar5;
  p->validYMD = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, alpha, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else if( !validJulianDay(p->iJD) ){
    datetimeError(p);
    return;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    alpha = (int)((Z + 32044.75)/36524.25) - 52;
    A = Z + 1 + alpha - ((alpha+100)/4) + 25;
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*(C&32767))/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}